

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::MapToNeighSide<Fad<double>>
          (TPZGeoBlend<pzgeom::TPZGeoQuad> *this,int side,int SideDim,
          TPZVec<Fad<double>_> *InternalPar,TPZVec<Fad<double>_> *NeighPar,
          TPZFMatrix<Fad<double>_> *JacNeighSide)

{
  bool bVar1;
  TPZFMatrix<Fad<double>_> *pTVar2;
  int64_t iVar3;
  int64_t iVar4;
  TPZVec<Fad<double>_> *in_RCX;
  int in_EDX;
  TPZManVector<Fad<double>,_3> *in_RDI;
  long *in_R8;
  long *in_R9;
  TPZTransform<Fad<double>_> tr;
  bool check;
  TPZManVector<Fad<double>,_3> SidePar;
  TPZFNMatrix<9,_Fad<double>_> JacSide;
  undefined8 in_stack_fffffffffffffa58;
  int side_00;
  long *plVar5;
  TPZGeoBlend<pzgeom::TPZGeoQuad> *in_stack_fffffffffffffa60;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffaa0;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffaa8;
  TPZTransform<Fad<double>_> *in_stack_fffffffffffffab0;
  TPZTransform<Fad<double>_> *in_stack_fffffffffffffad0;
  _func_int **in_stack_fffffffffffffaf8;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffffb00;
  TPZBaseMatrix local_200 [10];
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffff48;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffff50;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  int local_14 [4];
  byte local_1;
  
  side_00 = (int)((ulong)in_stack_fffffffffffffa58 >> 0x20);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<9,_Fad<double>_> *)in_stack_fffffffffffffab0);
  TPZManVector<Fad<double>,_3>::TPZManVector
            (in_stack_fffffffffffffb00,(int64_t)in_stack_fffffffffffffaf8);
  bVar1 = pztopology::TPZQuadrilateral::CheckProjectionForSingularity<Fad<double>>(local_14,in_RCX);
  pztopology::TPZQuadrilateral::MapToSide<Fad<double>>
            (in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  if (bVar1) {
    (**(code **)(*in_R8 + 0x18))(in_R8,(long)in_EDX);
    TPZTransform<Fad<double>_>::TPZTransform(in_stack_fffffffffffffad0);
    TransfBetweenNeigh<Fad<double>>
              (in_stack_fffffffffffffa60,side_00,(TPZTransform<Fad<double>_> *)0x168d915);
    TPZTransform<Fad<double>_>::Apply
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
    (**(code **)(*in_R9 + 0x68))(in_R9,0);
    TransfBetweenNeigh<Fad<double>>
              (in_stack_fffffffffffffa60,side_00,(TPZTransform<Fad<double>_> *)0x168d963);
    plVar5 = in_R9;
    pTVar2 = TPZTransform<Fad<double>_>::Mult
                       ((TPZTransform<Fad<double>_> *)&stack0xfffffffffffffa78);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)pTVar2);
    iVar4 = TPZBaseMatrix::Cols(local_200);
    (**(code **)(*plVar5 + 0x68))(plVar5,iVar3,iVar4);
    pTVar2 = TPZTransform<Fad<double>_>::Mult
                       ((TPZTransform<Fad<double>_> *)&stack0xfffffffffffffa78);
    (*(pTVar2->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0x25])(pTVar2,local_200,in_R9,0);
    local_1 = 1;
    TPZTransform<Fad<double>_>::~TPZTransform((TPZTransform<Fad<double>_> *)0x168d9f6);
  }
  else {
    local_1 = 0;
  }
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_RDI);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x168da32);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool
    pzgeom::TPZGeoBlend<TGeo>::MapToNeighSide(int side, int SideDim, TPZVec<T> &InternalPar, TPZVec<T> &NeighPar,
                                              TPZFMatrix<T> &JacNeighSide) const {
        TPZFNMatrix<9, T> JacSide;

        TPZManVector<T, 3> SidePar(SideDim);
        const bool check = TGeo::CheckProjectionForSingularity(side, InternalPar);

        this->MapToSide(side, InternalPar, SidePar, JacSide);
        if (!check) {
            #ifdef PZ_LOG2
            td::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";
            sout << "\tmapping is not regular"<<std::endl;
            LOGPZ_DEBUG(logger,sout.str())
            #endif
            return false;
        }
#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";

            sout << "SidePar: ";
            for(int i = 0; i < SidePar.NElements(); i++) sout << SidePar[i] << "\t";
            sout << "\n";

            JacSide.Print("JacSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        NeighPar.Resize(SideDim);
        TPZTransform<T> tr;
        TransfBetweenNeigh(side, tr);
        tr.Apply(SidePar, NeighPar);

        JacNeighSide.Resize(0, 0);
        TransfBetweenNeigh(side, tr);
        JacNeighSide.Resize(tr.Mult().Rows(), JacSide.Cols());
        tr.Mult().Multiply(JacSide, JacNeighSide);

#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            
            sout << "NeighPar: ";
            for(int i = 0; i < NeighPar.NElements(); i++) sout << NeighPar[i] << "\t";
            sout << "\n";
            
            JacNeighSide.Print("JacNeighSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        return true;
    }